

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> * __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++
          (PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *this)

{
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *this_local;
  
  MoveToNextNode(this);
  return this;
}

Assistant:

PostOrderTreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }